

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qelfparser_p.cpp
# Opt level: O0

QLibraryScanResult scanSections(QByteArrayView data,ErrorMaker *error)

{
  ushort uVar1;
  uint uVar2;
  undefined1 *puVar3;
  ulong uVar4;
  enable_if_t<std::is_unsigned_v<unsigned_long>,_bool> eVar5;
  bool bVar6;
  const_pointer pvVar7;
  ulong uVar8;
  const_pointer pvVar9;
  Shdr *pSVar10;
  QNoDebug *pQVar11;
  undefined1 *puVar12;
  size_t sz;
  ErrorMaker *in_RDX;
  long in_FS_OFFSET;
  size_t len;
  char *namestart;
  char *shstrtab_start;
  Shdr *shdr;
  Shdr *sections_end;
  Shdr *sections;
  Word e_shnum;
  Ehdr *header;
  QByteArrayView actualMagic;
  QByteArrayView expectedMagic;
  Off end_1;
  QLatin1StringView name;
  int section;
  Off end;
  Off shstrtab_size;
  Off offset;
  undefined4 in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcec;
  QLatin1StringView *in_stack_fffffffffffffcf0;
  char (*in_stack_fffffffffffffcf8) [12];
  QByteArrayView *in_stack_fffffffffffffd00;
  QString *in_stack_fffffffffffffd20;
  ErrorMaker *in_stack_fffffffffffffd28;
  ErrorMaker *in_stack_fffffffffffffd30;
  Shdr *local_1c0;
  QLibraryScanResult local_180;
  QByteArrayView local_118 [2];
  QNoDebug local_e9;
  QLatin1StringView local_e8;
  undefined1 *local_c0 [4];
  ElfSectionDebug local_a0;
  QNoDebug local_91;
  QLatin1String local_90;
  QLatin1String local_80;
  int local_6c [7];
  undefined1 *local_50;
  QNoDebug local_41;
  unsigned_long local_40 [4];
  ulong local_20;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar7 = QByteArrayView::data(&local_18);
  uVar1 = *(ushort *)(pvVar7 + 0x3c);
  local_20 = (ulong)(uint)uVar1 << 6;
  eVar5 = qAddOverflow<unsigned_long>(local_20,*(unsigned_long *)(pvVar7 + 0x28),&local_20);
  uVar4 = local_20;
  if ((eVar5) || (uVar8 = QByteArrayView::size(&local_18), uVar8 < uVar4)) {
    QLibrary::tr(*in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0,
                 in_stack_fffffffffffffcec);
    local_180 = anon_unknown.dwarf_1486d0f::ErrorMaker::operator()
                          (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
    QString::~QString((QString *)0x8cb04a);
  }
  else {
    pvVar9 = QByteArrayView::data(&local_18);
    local_1c0 = (Shdr *)(pvVar9 + *(long *)(pvVar7 + 0x28));
    pSVar10 = local_1c0 + (uint)uVar1;
    local_20 = local_1c0[(int)(uint)*(ushort *)(pvVar7 + 0x3e)].sh_offset;
    local_40[0] = local_1c0[(int)(uint)*(ushort *)(pvVar7 + 0x3e)].sh_size;
    pQVar11 = QNoDebug::operator<<(&local_41,(char (*) [38])"shstrtab section is located at offset")
    ;
    pQVar11 = QNoDebug::operator<<(pQVar11,&local_20);
    pQVar11 = QNoDebug::operator<<(pQVar11,(char (*) [5])0xa195ae);
    QNoDebug::operator<<(pQVar11,local_40);
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    eVar5 = qAddOverflow<unsigned_long>(local_20,local_40[0],(unsigned_long *)&local_50);
    puVar3 = local_50;
    if ((eVar5) || (puVar12 = (undefined1 *)QByteArrayView::size(&local_18), puVar12 < puVar3)) {
      QLibrary::tr(*in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0,
                   in_stack_fffffffffffffcec);
      local_180 = anon_unknown.dwarf_1486d0f::ErrorMaker::operator()
                            (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
      QString::~QString((QString *)0x8cb236);
    }
    else {
      pvVar7 = QByteArrayView::data(&local_18);
      uVar4 = local_20;
      local_6c[0] = 0;
      for (; local_1c0 != pSVar10; local_1c0 = local_1c0 + 1) {
        local_80.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_80.m_data = &DAT_aaaaaaaaaaaaaaaa;
        QLatin1String::QLatin1String(&local_80);
        if (local_1c0->sh_name < local_40[0]) {
          uVar2 = local_1c0->sh_name;
          sz = qstrnlen(*in_stack_fffffffffffffcf8,(size_t)in_stack_fffffffffffffcf0);
          QLatin1String::QLatin1String(&local_90,pvVar7 + uVar2 + uVar4,sz);
          local_80.m_size = local_90.m_size;
          local_80.m_data = local_90.m_data;
        }
        pQVar11 = QNoDebug::operator<<(&local_91,(char (*) [8])0xa194e7);
        pQVar11 = QNoDebug::operator<<(pQVar11,local_6c);
        pQVar11 = QNoDebug::operator<<(pQVar11,(char (*) [5])0xa19a6d);
        pQVar11 = QNoDebug::operator<<(pQVar11,&local_80);
        local_a0.shdr = local_1c0;
        QNoDebug::operator<<(pQVar11,&local_a0);
        bVar6 = QLatin1String::isNull((QLatin1String *)0x8cb3ea);
        if (bVar6) {
          QLibrary::tr(*in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0,
                       in_stack_fffffffffffffcec);
          local_180 = anon_unknown.dwarf_1486d0f::ErrorMaker::operator()
                                (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
          QString::~QString((QString *)0x8cb47c);
          goto LAB_008cba4e;
        }
        if (local_1c0->sh_type != 8) {
          local_c0[0] = &DAT_aaaaaaaaaaaaaaaa;
          eVar5 = qAddOverflow<unsigned_long>
                            (local_1c0->sh_offset,local_1c0->sh_size,(unsigned_long *)local_c0);
          puVar3 = local_c0[0];
          if ((eVar5) || (puVar12 = (undefined1 *)QByteArrayView::size(&local_18), puVar12 < puVar3)
             ) {
            QLibrary::tr(*in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0,
                         in_stack_fffffffffffffcec);
            local_180 = anon_unknown.dwarf_1486d0f::ErrorMaker::operator()
                                  (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
            QString::~QString((QString *)0x8cb5b3);
            goto LAB_008cba4e;
          }
          local_e8 = Qt::Literals::StringLiterals::operator____L1
                               (*in_stack_fffffffffffffcf8,(size_t)in_stack_fffffffffffffcf0);
          bVar6 = operator!=(in_stack_fffffffffffffcf0,
                             (QLatin1StringView *)
                             CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
          if (!bVar6) {
            QNoDebug::operator<<(&local_e9,(char (*) [26])"found .qtmetadata section");
            if (local_1c0->sh_size < 0x10) {
              QLibrary::tr(*in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0,
                           in_stack_fffffffffffffcec);
              local_180 = anon_unknown.dwarf_1486d0f::ErrorMaker::operator()
                                    (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
              QString::~QString((QString *)0x8cb6d3);
            }
            else {
              local_118[0].m_data = &DAT_aaaaaaaaaaaaaaaa;
              local_118[0].m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_118[0] = QByteArrayView::fromArray<char,_12UL,_true>(in_stack_fffffffffffffcf8);
              QByteArrayView::size(local_118);
              QByteArrayView::sliced
                        (in_stack_fffffffffffffd00,(qsizetype)in_stack_fffffffffffffcf8,
                         (qsizetype)in_stack_fffffffffffffcf0);
              bVar6 = operator!=((QByteArrayView *)in_stack_fffffffffffffcf0,
                                 (QByteArrayView *)
                                 CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
              if (bVar6) {
                QLibrary::tr(*in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0,
                             in_stack_fffffffffffffcec);
                local_180 = anon_unknown.dwarf_1486d0f::ErrorMaker::operator()
                                      (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
                QString::~QString((QString *)0x8cb832);
              }
              else if ((local_1c0->sh_flags & 1) == 0) {
                if ((local_1c0->sh_flags & 4) == 0) {
                  local_180.length = local_1c0->sh_size - 0xc;
                  local_180.pos = local_1c0->sh_offset + 0xc;
                }
                else {
                  QLibrary::tr(*in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0,
                               in_stack_fffffffffffffcec);
                  local_180 = anon_unknown.dwarf_1486d0f::ErrorMaker::operator()
                                        (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
                  QString::~QString((QString *)0x8cb9a6);
                }
              }
              else {
                QLibrary::tr(*in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0,
                             in_stack_fffffffffffffcec);
                local_180 = anon_unknown.dwarf_1486d0f::ErrorMaker::operator()
                                      (in_RDX,in_stack_fffffffffffffd20);
                QString::~QString((QString *)0x8cb8ec);
              }
            }
            goto LAB_008cba4e;
          }
        }
        local_6c[0] = local_6c[0] + 1;
      }
      local_180 = anon_unknown.dwarf_1486d0f::ErrorMaker::notfound(in_stack_fffffffffffffd30);
    }
  }
LAB_008cba4e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_180;
}

Assistant:

static QLibraryScanResult scanSections(QByteArrayView data, const ErrorMaker &error)
{
    auto header = reinterpret_cast<const T::Ehdr *>(data.data());

    // in order to find the .qtmetadata section, we need to:
    // a) find the section table
    //    it's located at offset header->e_shoff
    // validate it
    T::Word e_shnum = header->e_shnum;
    T::Off offset = e_shnum * sizeof(T::Shdr);          // can't overflow due to size of T::Half
    if (qAddOverflow(offset, header->e_shoff, &offset) || offset > size_t(data.size()))
        return error(QLibrary::tr("section table extends past the end of the file"));

    // b) find the section entry for the section header string table (shstrab)
    //    it's a section whose entry is pointed by e_shstrndx
    auto sections = reinterpret_cast<const T::Shdr *>(data.data() + header->e_shoff);
    auto sections_end = sections + e_shnum;
    auto shdr = sections + header->e_shstrndx;

    // validate the shstrtab
    offset = shdr->sh_offset;
    T::Off shstrtab_size = shdr->sh_size;
    qEDebug << "shstrtab section is located at offset" << offset << "size" << shstrtab_size;
    if (T::Off end; qAddOverflow<T::Off>(offset, shstrtab_size, &end)
            || end > size_t(data.size()))
        return error(QLibrary::tr("section header string table extends past the end of the file"));

    // c) iterate over the sections to find .qtmetadata
    const char *shstrtab_start = data.data() + offset;
    shdr = sections;
    for (int section = 0; shdr != sections_end; ++section, ++shdr) {
        QLatin1StringView name;
        if (shdr->sh_name < shstrtab_size) {
            const char *namestart = shstrtab_start + shdr->sh_name;
            size_t len = qstrnlen(namestart, shstrtab_size - shdr->sh_name);
            name = QLatin1StringView(namestart, len);
        }
        qEDebug << "section" << section << "name" << name << ElfSectionDebug{shdr};

        // sanity check the section
        if (name.isNull())
            return error(QLibrary::tr("a section name extends past the end of the file"));

        // sections aren't allowed to extend past the end of the file, unless
        // they are NOBITS sections
        if (shdr->sh_type == SHT_NOBITS)
            continue;
        if (T::Off end; qAddOverflow(shdr->sh_offset, shdr->sh_size, &end)
                || end > size_t(data.size())) {
            return error(QLibrary::tr("section contents extend past the end of the file"));
        }

        if (name != ".qtmetadata"_L1)
            continue;
        qEDebug << "found .qtmetadata section";
        if (shdr->sh_size < sizeof(QPluginMetaData::MagicHeader))
            return error(QLibrary::tr(".qtmetadata section is too small"));

        if (IncludeValidityChecks) {
            QByteArrayView expectedMagic = QByteArrayView::fromArray(QPluginMetaData::MagicString);
            QByteArrayView actualMagic = data.sliced(shdr->sh_offset, expectedMagic.size());
            if (expectedMagic != actualMagic)
                return error(QLibrary::tr(".qtmetadata section has incorrect magic"));

            if (shdr->sh_flags & SHF_WRITE)
                return error(QLibrary::tr(".qtmetadata section is writable"));
            if (shdr->sh_flags & SHF_EXECINSTR)
                return error(QLibrary::tr(".qtmetadata section is executable"));
        }

        return { qsizetype(shdr->sh_offset + sizeof(QPluginMetaData::MagicString)),
                 qsizetype(shdr->sh_size - sizeof(QPluginMetaData::MagicString)) };
    }

    // section .qtmetadata not found
    return error.notfound();
}